

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode JsSetEmbedderData(JsValueRef instance,JsValueRef embedderData)

{
  code *pcVar1;
  bool bVar2;
  JsErrorCode JVar3;
  BOOL BVar4;
  uint uVar5;
  int iVar6;
  JsrtContext *currentContext;
  RecyclableObject *pRVar7;
  undefined4 *puVar8;
  AutoNestedHandledExceptionType local_48 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (instance == (JsValueRef)0x0) {
    JVar3 = JsErrorInvalidArgument;
  }
  else {
    currentContext = JsrtContext::GetCurrent();
    JVar3 = CheckContext(currentContext,false,false);
    if (JVar3 == JsNoError) {
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      bVar2 = Js::VarIs<Js::RecyclableObject>(instance);
      JVar3 = JsErrorInvalidArgument;
      if (bVar2) {
        pRVar7 = Js::UnsafeVarTo<Js::RecyclableObject>(instance);
        if (pRVar7 != (RecyclableObject *)0x0) {
          BVar4 = Js::TypedArrayBase::Is(((pRVar7->type).ptr)->typeId);
          if ((BVar4 == 0) &&
             ((uVar5 = ((pRVar7->type).ptr)->typeId - TypeIds_ArrayBuffer, 0x20 < uVar5 ||
              ((0x100008001U >> ((ulong)uVar5 & 0x3f) & 1) == 0)))) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar8 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtCore.cpp"
                               ,0x22c,
                               "(Js::TypedArrayBase::Is(object->GetTypeId()) || object->GetTypeId() == Js::TypeIds_ArrayBuffer || object->GetTypeId() == Js::TypeIds_DataView || object->GetTypeId() == Js::TypeIds_SharedArrayBuffer)"
                               ,
                               "Js::TypedArrayBase::Is(object->GetTypeId()) || object->GetTypeId() == Js::TypeIds_ArrayBuffer || object->GetTypeId() == Js::TypeIds_DataView || object->GetTypeId() == Js::TypeIds_SharedArrayBuffer"
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar8 = 0;
          }
          JVar3 = JsNoError;
          iVar6 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x19])(pRVar7,0xf,embedderData,0,0);
          if (iVar6 == 0) {
            JVar3 = JsErrorInvalidArgument;
          }
        }
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
    }
  }
  return JVar3;
}

Assistant:

CHAKRA_API
JsSetEmbedderData(_In_ JsValueRef instance, _In_ JsValueRef embedderData)
{
   VALIDATE_JSREF(instance);
   return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext* scriptContext) -> JsErrorCode {
        Js::RecyclableObject* object = Js::JavascriptOperators::TryFromVar<Js::RecyclableObject>(instance);
        if (!object)
        {
            return JsErrorInvalidArgument;
        }

        // Right now we know that we support these many. Lets find out if
        // there are more.
        Assert(Js::TypedArrayBase::Is(object->GetTypeId()) ||
               object->GetTypeId() == Js::TypeIds_ArrayBuffer ||
               object->GetTypeId() == Js::TypeIds_DataView ||
               object->GetTypeId() == Js::TypeIds_SharedArrayBuffer);

        if (!object->SetInternalProperty(Js::InternalPropertyIds::EmbedderData, embedderData, Js::PropertyOperationFlags::PropertyOperation_None, nullptr))
        {
           return JsErrorInvalidArgument;
        }

        return JsNoError;
    });
}